

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  long *local_78;
  long local_70;
  long local_68;
  undefined8 uStack_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28;
  undefined8 uStack_20;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," selected ",10);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"test","");
  if (this->n == 1) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_58,local_50 + (long)local_58);
  }
  else {
    local_38 = &local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,local_58,local_50 + (long)local_58);
    std::__cxx11::string::append((char *)&local_38);
    local_78 = &local_68;
    if (local_38 == &local_28) {
      uStack_60 = uStack_20;
    }
    else {
      local_78 = local_38;
    }
    local_68 = local_28;
    local_70 = local_30;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_78,local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }